

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbcGlucose.cpp
# Opt level: O3

int bmcg_sat_solver_equiv_overlap_check
              (bmcg_sat_solver *pSat,Gia_Man_t *p,int iLit0,int iLit1,int fEquiv)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  SimpSolver *S;
  int iVar4;
  int iVar5;
  Vec_Int_t *p_00;
  int *piVar6;
  long lVar7;
  int Fill;
  bmcg_sat_solver *pSats [2];
  uint local_58;
  uint local_54;
  SimpSolver *local_50;
  bmcg_sat_solver *local_48;
  undefined8 local_40;
  
  local_40 = 0;
  local_50 = (SimpSolver *)pSat;
  local_48 = pSat;
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar6 = (int *)malloc(400);
  p_00->pArray = piVar6;
  if ((p->vCopies).nSize < p->nObjs) {
    Vec_IntFillExtra(&p->vCopies,p->nObjs,Fill);
  }
  Vec_IntPush(p_00,0);
  if ((p->vCopies).nSize < 1) {
LAB_005be612:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  *(p->vCopies).pArray = 0;
  if ((iLit0 < 0) ||
     (iVar4 = Gia_ManSatAndCollect_rec(p,(uint)iLit0 >> 1,p_00,(Vec_Int_t *)0x0), iLit1 < 0)) {
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x12f,"int Abc_Lit2Var(int)");
  }
  iVar5 = Gia_ManSatAndCollect_rec(p,(uint)iLit1 >> 1,p_00,(Vec_Int_t *)0x0);
  if ((iVar4 < 0) || (iVar5 < 0)) {
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x12e,"int Abc_Var2Lit(int, int)");
  }
  Gia_ManQuantLoadCnf(p,p_00,&local_48);
  piVar6 = p_00->pArray;
  if (p_00->nSize < 1) {
    if (piVar6 == (int *)0x0) goto LAB_005be582;
  }
  else {
    lVar7 = 0;
    do {
      iVar3 = piVar6[lVar7];
      if (((long)iVar3 < 0) || ((p->vCopies).nSize <= iVar3)) goto LAB_005be612;
      (p->vCopies).pArray[iVar3] = -1;
      lVar7 = lVar7 + 1;
    } while (lVar7 < p_00->nSize);
  }
  free(piVar6);
LAB_005be582:
  uVar1 = (iLit0 & 1U) + iVar4 * 2;
  uVar2 = (iLit1 & 1U) + iVar5 * 2;
  free(p_00);
  S = local_50;
  local_58 = uVar1;
  if (fEquiv == 0) {
    iVar4 = 1;
  }
  else {
    local_54 = uVar2 ^ 1;
    iVar4 = glucose_solver_solve(local_50,(int *)&local_58,2);
    if (iVar4 != -1) {
      return 0;
    }
    iVar4 = -1;
    local_58 = uVar1 ^ 1;
  }
  local_54 = uVar2;
  iVar5 = glucose_solver_solve(S,(int *)&local_58,2);
  return (uint)(iVar5 == iVar4);
}

Assistant:

int bmcg_sat_solver_equiv_overlap_check( bmcg_sat_solver * pSat, Gia_Man_t * p, int iLit0, int iLit1, int fEquiv )
{
    bmcg_sat_solver * pSats[2] = { pSat, NULL };
    Vec_Int_t * vObjsUsed = Vec_IntAlloc( 100 ); 
    int i, iVar, iSatVar[2], iSatLit[2], Lits[2], status;
    if ( Vec_IntSize(&p->vCopies) < Gia_ManObjNum(p) )
        Vec_IntFillExtra( &p->vCopies, Gia_ManObjNum(p), -1 );

    // assign const0 variable number 0
    iVar = Vec_IntSize(vObjsUsed);
    Vec_IntPush( vObjsUsed, 0 );
    Gia_ObjSetCopyArray( p, 0, iVar );
    assert( iVar == 0 );

    iSatVar[0] = Gia_ManSatAndCollect_rec( p, Abc_Lit2Var(iLit0), vObjsUsed, NULL );
    iSatVar[1] = Gia_ManSatAndCollect_rec( p, Abc_Lit2Var(iLit1), vObjsUsed, NULL );

    iSatLit[0] = Abc_Var2Lit( iSatVar[0], Abc_LitIsCompl(iLit0) );
    iSatLit[1] = Abc_Var2Lit( iSatVar[1], Abc_LitIsCompl(iLit1) );
    Gia_ManQuantLoadCnf( p, vObjsUsed, pSats );
    Vec_IntForEachEntry( vObjsUsed, iVar, i )
        Gia_ObjSetCopyArray( p, iVar, -1 );
    Vec_IntFree( vObjsUsed );

    if ( fEquiv )
    {
        Lits[0] = iSatLit[0];
        Lits[1] = Abc_LitNot(iSatLit[1]);
        status  = bmcg_sat_solver_solve( pSats[0], Lits, 2 );
        if ( status == GLUCOSE_UNSAT )
        {
            Lits[0] = Abc_LitNot(iSatLit[0]);
            Lits[1] = iSatLit[1];
            status  = bmcg_sat_solver_solve( pSats[0], Lits, 2 );
        }
        return status == GLUCOSE_UNSAT;
    }
    else
    {
        Lits[0] = iSatLit[0];
        Lits[1] = iSatLit[1];
        status  = bmcg_sat_solver_solve( pSats[0], Lits, 2 );
        return status == GLUCOSE_SAT;
    }
}